

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
* __thiscall
toml::detail::region::take_line_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
           *__return_storage_ptr__,region *this,const_iterator begin,const_iterator end)

{
  uchar *puVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  element_type *peVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  uchar *puVar4;
  unsigned_long uVar5;
  char_type lf;
  string retval;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  lf_before;
  uchar local_91;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uchar *local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  
  peVar3 = (this->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  puVar4 = (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_48 = begin._M_current + -0x1e;
  if ((long)begin._M_current - (long)puVar4 < 0x1f) {
    local_48 = puVar4;
  }
  puVar4 = end._M_current + 0x1e;
  if ((long)puVar1 - (long)end._M_current < 0x1f) {
    puVar4 = puVar1;
  }
  local_91 = '\n';
  last._M_current = &local_91;
  local_90 = __return_storage_ptr__;
  local_40.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )begin._M_current;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_char>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_38,&local_40,(uchar *)&local_48);
  first = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                    (end._M_current,puVar4,&local_91);
  uVar5 = (long)begin._M_current - (long)local_38._M_current;
  make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_88,(detail *)local_38._M_current,first,last);
  peVar3 = (this->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (((detail *)local_38._M_current !=
       (detail *)
       (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start) && (*(detail *)(local_38._M_current + -1) != (detail)0xa))
  {
    std::operator+(&local_68,"... ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    uVar5 = uVar5 + 4;
    peVar3 = (this->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  if ((first._M_current !=
       (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish) && (*first._M_current != '\n')) {
    std::operator+(&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                   " ...");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  ppVar2 = local_90;
  std::__cxx11::string::string
            ((string *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  ppVar2->second = uVar5;
  std::__cxx11::string::~string((string *)&local_88);
  return ppVar2;
}

Assistant:

TOML11_INLINE std::pair<std::string, std::size_t>
region::take_line(const_iterator begin, const_iterator end) const
{
    // To omit long line, we cap region by before/after 30 chars
    const auto dist_before = std::distance(source_->cbegin(), begin);
    const auto dist_after  = std::distance(end, source_->cend());

    const const_iterator capped_begin = (dist_before <= 30) ? source_->cbegin() : std::prev(begin, 30);
    const const_iterator capped_end   = (dist_after  <= 30) ? source_->cend()   : std::next(end,   30);

    const auto lf = char_type('\n');
    const auto lf_before = std::find(cxx::make_reverse_iterator(begin),
                                     cxx::make_reverse_iterator(capped_begin), lf);
    const auto lf_after  = std::find(end, capped_end, lf);

    auto offset = static_cast<std::size_t>(std::distance(lf_before.base(), begin));

    std::string retval = make_string(lf_before.base(), lf_after);

    if(lf_before.base() != source_->cbegin() && *lf_before != lf)
    {
        retval = "... " + retval;
        offset += 4;
    }

    if(lf_after != source_->cend() && *lf_after != lf)
    {
        retval = retval + " ...";
    }

    return std::make_pair(retval, offset);
}